

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_connect2(uv_connect_t *req,uv_pipe_t *handle,char *name,size_t namelen,uint flags,
                    uv_connect_cb cb)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  socklen_t local_c0;
  socklen_t addrlen;
  int r;
  int err;
  int new_sock;
  sockaddr_un saddr;
  uv_connect_cb cb_local;
  size_t sStack_30;
  uint flags_local;
  size_t namelen_local;
  char *name_local;
  uv_pipe_t *handle_local;
  uv_connect_t *req_local;
  
  if ((flags & 0xfffffffe) != 0) {
    return -0x16;
  }
  if (name == (char *)0x0) {
    return -0x16;
  }
  if (namelen == 0) {
    return -0x16;
  }
  saddr.sun_path._100_8_ = cb;
  iVar1 = includes_nul(name,namelen);
  if (iVar1 != 0) {
    return -0x16;
  }
  if (((flags & 1) != 0) && (0x6c < namelen)) {
    return -0x16;
  }
  sStack_30 = namelen;
  if (0x6c < namelen) {
    sStack_30 = 0x6c;
  }
  bVar3 = (handle->io_watcher).fd == -1;
  if (bVar3) {
    addrlen = uv__socket(1,1,0);
    if ((int)addrlen < 0) goto LAB_0011c319;
    (handle->io_watcher).fd = addrlen;
  }
  memset((void *)((long)&err + 2),0,0x6e);
  memcpy(&new_sock,name,sStack_30);
  err._2_2_ = 1;
  if (*name == '\0') {
    local_c0 = (int)sStack_30 + 2;
  }
  else {
    local_c0 = 0x6e;
  }
  do {
    iVar1 = connect((handle->io_watcher).fd,(sockaddr *)((long)&err + 2),local_c0);
    bVar4 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0x73)) {
    piVar2 = __errno_location();
    addrlen = -*piVar2;
  }
  else {
    addrlen = 0;
    if (bVar3) {
      addrlen = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0xc000);
    }
    if (addrlen == 0) {
      uv__io_start(handle->loop,&handle->io_watcher,4);
    }
  }
LAB_0011c319:
  handle->delayed_error = addrlen;
  handle->connect_req = req;
  req->type = UV_CONNECT;
  (handle->loop->active_reqs).count = (handle->loop->active_reqs).count + 1;
  req->handle = (uv_stream_t *)handle;
  req->cb = (uv_connect_cb)saddr.sun_path._100_8_;
  uv__queue_init(&req->queue);
  if (addrlen != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return 0;
}

Assistant:

int uv_pipe_connect2(uv_connect_t* req,
                     uv_pipe_t* handle,
                     const char* name,
                     size_t namelen,
                     unsigned int flags,
                     uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;
  socklen_t addrlen;

  if (flags & ~UV_PIPE_NO_TRUNCATE)
    return UV_EINVAL;

  if (name == NULL)
    return UV_EINVAL;

  if (namelen == 0)
    return UV_EINVAL;

  if (includes_nul(name, namelen))
    return UV_EINVAL;

  if (flags & UV_PIPE_NO_TRUNCATE)
    if (namelen > sizeof(saddr.sun_path))
      return UV_EINVAL;

  /* Truncate long paths. Documented behavior. */
  if (namelen > sizeof(saddr.sun_path))
    namelen = sizeof(saddr.sun_path);

  new_sock = (uv__stream_fd(handle) == -1);

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  memcpy(&saddr.sun_path, name, namelen);
  saddr.sun_family = AF_UNIX;

  if (*name == '\0')
    addrlen = offsetof(struct sockaddr_un, sun_path) + namelen;
  else
    addrlen = sizeof saddr;

  do {
    r = connect(uv__stream_fd(handle), (struct sockaddr*)&saddr, addrlen);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = UV__ERR(errno);
#if defined(__CYGWIN__) || defined(__MSYS__)
    /* EBADF is supposed to mean that the socket fd is bad, but
       Cygwin reports EBADF instead of ENOTSOCK when the file is
       not a socket.  We do not expect to see a bad fd here
       (e.g. due to new_sock), so translate the error.  */
    if (err == UV_EBADF)
      err = UV_ENOTSOCK;
#endif
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*) handle;
  req->cb = cb;
  uv__queue_init(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}